

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O0

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::
decodeUnionIndex(JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  Token TVar1;
  allocator<char> *in_RDI;
  string *in_stack_00000008;
  SimpleParser<avro::parsing::JsonDecoderHandler> *in_stack_00000010;
  size_t result;
  Kind in_stack_000001f4;
  SimpleParser<avro::parsing::JsonDecoderHandler> *in_stack_000001f8;
  undefined4 in_stack_ffffffffffffff58;
  Token in_stack_ffffffffffffff5c;
  JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>
  *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc8;
  SimpleParser<avro::parsing::JsonDecoderHandler> *in_stack_ffffffffffffffd0;
  size_t local_10;
  
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(in_stack_000001f8,in_stack_000001f4);
  TVar1 = json::JsonParser::peek((JsonParser *)in_stack_ffffffffffffff60);
  if (TVar1 == tkNull) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI);
    local_10 = SimpleParser<avro::parsing::JsonDecoderHandler>::indexForName
                         (in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  else {
    expect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    expect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    json::JsonParser::stringValue_abi_cxx11_
              ((JsonParser *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_10 = SimpleParser<avro::parsing::JsonDecoderHandler>::indexForName
                         (in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  SimpleParser<avro::parsing::JsonDecoderHandler>::selectBranch
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return local_10;
}

Assistant:

size_t JsonDecoder<P>::decodeUnionIndex()
{
    parser_.advance(Symbol::sUnion);

    size_t result;
    if (in_.peek() == JsonParser::tkNull) {
        result = parser_.indexForName("null");
    } else {
        expect(JsonParser::tkObjectStart);
        expect(JsonParser::tkString);
        result = parser_.indexForName(in_.stringValue());
    }
    parser_.selectBranch(result);
    return result;
}